

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::updateWindowSize(GLEngine *this,bool force)

{
  int iVar1;
  int iVar2;
  undefined1 in_SIL;
  int newWindowHeight;
  int newWindowWidth;
  int newBufferHeight;
  int newBufferWidth;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  undefined3 in_stack_fffffffffffffff4;
  uint uVar3;
  
  uVar3 = CONCAT13(in_SIL,in_stack_fffffffffffffff4) & 0x1ffffff;
  glfwGetFramebufferSize
            ((GLFWwindow *)
             (CONCAT44(CONCAT13(in_SIL,in_stack_fffffffffffffff4),in_stack_fffffffffffffff0) &
             0x1ffffffffffffff),(int *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8)
             ,(int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  glfwGetWindowSize((GLFWwindow *)CONCAT44(uVar3,in_stack_fffffffffffffff0),
                    (int *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                    (int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (((((uVar3 & 0x1000000) != 0) || (in_stack_fffffffffffffff0 != view::bufferWidth)) ||
      (in_stack_ffffffffffffffec != view::bufferHeight)) ||
     ((in_stack_ffffffffffffffe4 != view::windowHeight ||
      (in_stack_ffffffffffffffe8 != view::windowWidth)))) {
    iVar1 = in_stack_ffffffffffffffe8;
    iVar2 = in_stack_fffffffffffffff0;
    requestRedraw();
    view::bufferWidth = iVar2;
    view::windowWidth = iVar1;
    view::bufferHeight = in_stack_ffffffffffffffec;
    if (in_stack_ffffffffffffffec == 0) {
      view::bufferHeight = 1;
    }
    view::windowHeight = in_stack_ffffffffffffffe4;
    if (in_stack_ffffffffffffffe4 == 0) {
      view::windowHeight = 1;
    }
    (**(code **)(*render::engine + 0x38))();
    (**(code **)(*render::engine + 0x40))();
  }
  return;
}

Assistant:

void GLEngine::updateWindowSize(bool force) {
  int newBufferWidth, newBufferHeight, newWindowWidth, newWindowHeight;
  glfwGetFramebufferSize(mainWindow, &newBufferWidth, &newBufferHeight);
  glfwGetWindowSize(mainWindow, &newWindowWidth, &newWindowHeight);
  if (force || newBufferWidth != view::bufferWidth || newBufferHeight != view::bufferHeight ||
      newWindowHeight != view::windowHeight || newWindowWidth != view::windowWidth) {
    // Basically a resize callback
    requestRedraw();

    // prevent any division by zero for e.g. aspect ratio calcs
    if (newBufferHeight == 0) newBufferHeight = 1;
    if (newWindowHeight == 0) newWindowHeight = 1;

    view::bufferWidth = newBufferWidth;
    view::bufferHeight = newBufferHeight;
    view::windowWidth = newWindowWidth;
    view::windowHeight = newWindowHeight;

    render::engine->resizeScreenBuffers();
    render::engine->setScreenBufferViewports();
  }
}